

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O1

void __thiscall
chrono::curiosity::CuriosityPart::CalcMassProperties(CuriosityPart *this,double density)

{
  double *pdVar1;
  long *plVar2;
  double *pdVar3;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> trimesh_col;
  double vol;
  string mesh_filename;
  ChMatrix33<double> cog_rot;
  ChVector<double> cog_pos;
  ChMatrix33<double> inertia;
  long *local_1e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1d8;
  double local_1d0;
  double local_1c8;
  long *local_1c0 [2];
  long local_1b0 [2];
  undefined1 local_1a0 [72];
  ChVector<double> local_158;
  ChFrame<double> local_140;
  double local_b8;
  double local_b0;
  double local_a8;
  ChMatrix33<double> local_a0;
  double local_58;
  double dStack_50;
  double dStack_48;
  double dStack_40;
  double dStack_38;
  double dStack_30;
  double dStack_28;
  double dStack_20;
  double local_18;
  
  local_1d0 = density;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
                 "robot/curiosity/col/",&this->m_mesh_name);
  plVar2 = (long *)std::__cxx11::string::append((char *)local_1a0);
  pdVar1 = local_140.coord.pos.m_data + 1;
  pdVar3 = (double *)(plVar2 + 2);
  if ((double *)*plVar2 == pdVar3) {
    local_140.coord.pos.m_data[1] = *pdVar3;
    local_140.coord.pos.m_data[2] = (double)plVar2[3];
    local_140._vptr_ChFrame = (_func_int **)pdVar1;
  }
  else {
    local_140.coord.pos.m_data[1] = *pdVar3;
    local_140._vptr_ChFrame = (_func_int **)*plVar2;
  }
  local_140.coord.pos.m_data[0] = (double)plVar2[1];
  *plVar2 = (long)pdVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  chrono::GetChronoDataFile((string *)local_1c0);
  if (local_140._vptr_ChFrame != (_func_int **)pdVar1) {
    operator_delete(local_140._vptr_ChFrame,(long)local_140.coord.pos.m_data[1] + 1);
  }
  if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
    operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
  }
  chrono::geometry::ChTriangleMeshConnected::CreateFromWavefrontFile
            ((string *)&local_1e0,SUB81(local_1c0,0),false);
  local_b8 = (this->m_mesh_xform).coord.pos.m_data[0];
  local_b0 = (this->m_mesh_xform).coord.pos.m_data[1];
  local_a8 = (this->m_mesh_xform).coord.pos.m_data[2];
  local_18 = *(double *)
              ((long)(this->m_mesh_xform).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array + 0x40);
  local_58 = (this->m_mesh_xform).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  dStack_50 = *(double *)
               ((long)(this->m_mesh_xform).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                      array + 8);
  dStack_48 = *(double *)
               ((long)(this->m_mesh_xform).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                      array + 0x10);
  dStack_40 = *(double *)
               ((long)(this->m_mesh_xform).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                      array + 0x18);
  dStack_38 = *(double *)
               ((long)(this->m_mesh_xform).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                      array + 0x20);
  dStack_30 = *(double *)
               ((long)(this->m_mesh_xform).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                      array + 0x28);
  dStack_28 = *(double *)
               ((long)(this->m_mesh_xform).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                      array + 0x30);
  dStack_20 = *(double *)
               ((long)(this->m_mesh_xform).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                      array + 0x38);
  (**(code **)(*local_1e0 + 0x80))();
  chrono::geometry::ChTriangleMeshConnected::RepairDuplicateVertexes(1e-09);
  local_158.m_data[0] = 0.0;
  local_158.m_data[1] = 0.0;
  local_158.m_data[2] = 0.0;
  chrono::geometry::ChTriangleMeshConnected::ComputeMassProperties
            ((bool)local_1e0._0_1_,(double *)0x1,(ChVector *)&local_1c8,(ChMatrix33 *)&local_158);
  ChInertiaUtils::PrincipalInertia(&local_a0,&this->m_inertia,(ChMatrix33<double> *)local_1a0);
  this->m_mass = local_1d0 * local_1c8;
  (this->m_inertia).m_data[0] = local_1d0 * (this->m_inertia).m_data[0];
  (this->m_inertia).m_data[1] = local_1d0 * (this->m_inertia).m_data[1];
  (this->m_inertia).m_data[2] = local_1d0 * (this->m_inertia).m_data[2];
  ChFrame<double>::ChFrame(&local_140,&local_158,(ChMatrix33<double> *)local_1a0);
  ChFrame<double>::operator=(&this->m_cog,&local_140);
  if (local_1d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d8);
  }
  if (local_1c0[0] != local_1b0) {
    operator_delete(local_1c0[0],local_1b0[0] + 1);
  }
  return;
}

Assistant:

void CuriosityPart::CalcMassProperties(double density) {
    auto mesh_filename = GetChronoDataFile("robot/curiosity/col/" + m_mesh_name + ".obj");
    auto trimesh_col = geometry::ChTriangleMeshConnected::CreateFromWavefrontFile(mesh_filename, false, false);
    trimesh_col->Transform(m_mesh_xform.GetPos(), m_mesh_xform.GetA());  // translate/rotate/scale mesh
    trimesh_col->RepairDuplicateVertexes(1e-9);                          // if meshes are not watertight

    double vol;
    ChVector<> cog_pos;
    ChMatrix33<> cog_rot;
    ChMatrix33<> inertia;
    trimesh_col->ComputeMassProperties(true, vol, cog_pos, inertia);
    ChInertiaUtils::PrincipalInertia(inertia, m_inertia, cog_rot);
    m_mass = density * vol;
    m_inertia *= density;
    m_cog = ChFrame<>(cog_pos, cog_rot);
}